

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool SetPropertyCommand::HandleSourceFileDirectoryScopes
               (cmExecutionStatus *status,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories,
               vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles)

{
  string *psVar1;
  pointer pbVar2;
  string *in_base;
  cmGlobalGenerator *pcVar3;
  cmMakefile *pcVar4;
  iterator iVar5;
  cmTarget *this;
  string *psVar6;
  bool bVar7;
  pointer name;
  cmMakefile *dir_mf;
  cmMakefile *current_dir_mf;
  string absolute_dir_path;
  cmMakefile *target_dir_mf;
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  directory_makefiles_set;
  cmMakefile *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_130;
  cmMakefile *local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  string *local_118;
  cmMakefile *local_110;
  string local_108;
  cmAlphaNum local_e8;
  _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b8;
  cmAlphaNum local_80;
  string local_50;
  
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_128 = status->Makefile;
  psVar6 = (source_file_directories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (source_file_directories->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_130 = source_file_target_directories;
  local_120 = source_file_directories;
  local_110 = local_128;
  if (psVar6 == psVar1) {
LAB_00321130:
    name = (local_130->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (local_130->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (name != pbVar2) {
      for (; name != pbVar2; name = name + 1) {
        this = cmMakefile::FindTargetToUse(local_128,name,false);
        if (this == (cmTarget *)0x0) {
          local_e8.View_._M_len = 0x2f;
          local_e8.View_._M_str = "given non-existent target for TARGET_DIRECTORY ";
          local_80.View_._M_str = (name->_M_dataplus)._M_p;
          local_80.View_._M_len = name->_M_string_length;
          cmStrCat<>(&local_108,&local_e8,&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_108);
          goto LAB_0032127e;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"BINARY_DIR",(allocator<char> *)&local_80);
        psVar6 = (string *)cmTarget::GetProperty(this,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        pcVar3 = cmMakefile::GetGlobalGenerator(status->Makefile);
        if (psVar6 == (string *)0x0) {
          psVar6 = &cmValue::Empty_abi_cxx11_;
        }
        local_e8.View_._M_len = (size_t)cmGlobalGenerator::FindMakefile(pcVar3,psVar6);
        iVar5 = std::
                _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&local_b8,(key_type *)&local_e8);
        if (iVar5.super__Node_iterator_base<cmMakefile_*,_false>._M_cur == (__node_type *)0x0) {
          std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                    (directory_makefiles,(value_type *)&local_e8);
          std::__detail::
          _Insert_base<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&local_b8,(value_type *)&local_e8);
        }
      }
    }
    bVar7 = true;
    if (((local_120->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (local_120->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) &&
       ((local_130->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (local_130->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (directory_makefiles,&local_110);
    }
  }
  else {
    local_118 = (string *)&status->Error;
    do {
      if (psVar6 == psVar1) goto LAB_00321130;
      in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_128);
      cmsys::SystemTools::CollapseFullPath(&local_108,psVar6,in_base);
      pcVar3 = cmMakefile::GetGlobalGenerator(status->Makefile);
      pcVar4 = cmGlobalGenerator::FindMakefile(pcVar3,&local_108);
      local_138 = pcVar4;
      if (pcVar4 == (cmMakefile *)0x0) {
        local_e8.View_._M_len = 0x1d;
        local_e8.View_._M_str = "given non-existent DIRECTORY ";
        local_80.View_._M_str = (psVar6->_M_dataplus)._M_p;
        local_80.View_._M_len = psVar6->_M_string_length;
        cmStrCat<>(&local_50,&local_e8,&local_80);
        std::__cxx11::string::_M_assign(local_118);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        iVar5 = std::
                _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&local_b8,&local_138);
        if (iVar5.super__Node_iterator_base<cmMakefile_*,_false>._M_cur == (__node_type *)0x0) {
          std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                    (directory_makefiles,&local_138);
          std::__detail::
          _Insert_base<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&local_b8,&local_138);
        }
      }
      std::__cxx11::string::~string((string *)&local_108);
      psVar6 = psVar6 + 1;
    } while (pcVar4 != (cmMakefile *)0x0);
LAB_0032127e:
    bVar7 = false;
  }
  std::
  _Hashtable<cmMakefile_*,_cmMakefile_*,_std::allocator<cmMakefile_*>,_std::__detail::_Identity,_std::equal_to<cmMakefile_*>,_std::hash<cmMakefile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  return bVar7;
}

Assistant:

bool HandleSourceFileDirectoryScopes(
  cmExecutionStatus& status, std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories,
  std::vector<cmMakefile*>& directory_makefiles)
{
  std::unordered_set<cmMakefile*> directory_makefiles_set;

  cmMakefile* current_dir_mf = &status.GetMakefile();
  if (!source_file_directories.empty()) {
    for (const std::string& dir_path : source_file_directories) {
      const std::string absolute_dir_path = cmSystemTools::CollapseFullPath(
        dir_path, current_dir_mf->GetCurrentSourceDirectory());
      cmMakefile* dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          absolute_dir_path);
      if (!dir_mf) {
        status.SetError(cmStrCat("given non-existent DIRECTORY ", dir_path));
        return false;
      }
      if (directory_makefiles_set.find(dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(dir_mf);
        directory_makefiles_set.insert(dir_mf);
      }
    }
  }

  if (!source_file_target_directories.empty()) {
    for (const std::string& target_name : source_file_target_directories) {
      cmTarget* target = current_dir_mf->FindTargetToUse(target_name);
      if (!target) {
        status.SetError(cmStrCat(
          "given non-existent target for TARGET_DIRECTORY ", target_name));
        return false;
      }
      cmValue target_source_dir = target->GetProperty("BINARY_DIR");
      cmMakefile* target_dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          *target_source_dir);

      if (directory_makefiles_set.find(target_dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(target_dir_mf);
        directory_makefiles_set.insert(target_dir_mf);
      }
    }
  }

  if (source_file_directories.empty() &&
      source_file_target_directories.empty()) {
    directory_makefiles.push_back(current_dir_mf);
  }
  return true;
}